

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

hugeint_t duckdb::DivideOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t left,hugeint_t right)

{
  InternalException *this;
  long in_RCX;
  long in_RDX;
  hugeint_t hVar1;
  hugeint_t local_60;
  hugeint_t local_50;
  string local_40;
  
  if (in_RDX != 0 || in_RCX != 0) {
    hVar1 = hugeint_t::operator/(&local_50,&local_60);
    return hVar1;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Hugeint division by zero!","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

hugeint_t DivideOperator::Operation(hugeint_t left, hugeint_t right) {
	if (right.lower == 0 && right.upper == 0) {
		throw InternalException("Hugeint division by zero!");
	}
	return left / right;
}